

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O1

HelicsFilter
helicsFederateRegisterFilter(HelicsFederate fed,HelicsFilterTypes type,char *name,HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  Filter *pFVar4;
  HelicsFilter pvVar5;
  pointer *__ptr;
  char *in_R8;
  string_view name_00;
  __single_object filt;
  FilterObject *local_78;
  _Head_base<0UL,_helics::FilterObject_*,_false> local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  long *local_50;
  Federate *local_48;
  long local_40 [2];
  
  getFedSharedPtr(&local_68,(HelicsError *)fed);
  peVar1 = local_68;
  if (local_68 == (element_type *)0x0) {
    pvVar5 = (HelicsFilter)0x0;
  }
  else {
    local_78 = (FilterObject *)operator_new(0x58);
    (local_78->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_78->buffer)._M_dataplus._M_p = (pointer)0x0;
    (local_78->buffer)._M_string_length = 0;
    (local_78->buffer).field_2._M_allocated_capacity = 0;
    (local_78->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_78->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_78->uFilter)._M_t.
    super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
    (local_78->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_78->cloning = false;
    local_78->custom = false;
    *(undefined2 *)&local_78->field_0x2 = 0;
    local_78->valid = 0;
    local_78->filtPtr = (Filter *)0x0;
    *(undefined8 *)((long)&(local_78->buffer).field_2 + 8) = 0;
    (local_78->buffer)._M_dataplus._M_p = (pointer)&(local_78->buffer).field_2;
    (local_78->buffer)._M_string_length = 0;
    (local_78->buffer).field_2._M_local_buf[0] = '\0';
    local_50 = local_40;
    if (name == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar3 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar3);
    }
    name_00._M_str = in_R8;
    name_00._M_len = (size_t)local_50;
    pFVar4 = helics::make_filter((helics *)(ulong)type,(FilterTypes)peVar1,local_48,name_00);
    local_78->filtPtr = pFVar4;
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    p_Var2 = p_Stack_60;
    peVar1 = local_68;
    local_68 = (element_type *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_78->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (local_78->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (local_78->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var2;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    local_78->custom = type == HELICS_FILTER_TYPE_CUSTOM;
    local_70._M_head_impl = local_78;
    local_78 = (FilterObject *)0x0;
    pvVar5 = anon_unknown.dwarf_bbcfa::federateAddFilter
                       (fed,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                             *)&local_70);
    if (local_70._M_head_impl != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_70,local_70._M_head_impl);
    }
    local_70._M_head_impl = (FilterObject *)0x0;
    if (local_78 != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_78,local_78);
    }
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  return pvVar5;
}

Assistant:

HelicsFilter helicsFederateRegisterFilter(HelicsFederate fed, HelicsFilterTypes type, const char* name, HelicsError* err)
{
    // now generate a generic subscription
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->filtPtr = &helics::make_filter(static_cast<helics::FilterTypes>(type), fedObj.get(), AS_STRING(name));
        filt->fedptr = std::move(fedObj);
        filt->custom = (type == HELICS_FILTER_TYPE_CUSTOM);
        return federateAddFilter(fed, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}